

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O3

Vec_Vec_t * Gia_ManAssignCodes(int kHot,int nStates,int *pnBits)

{
  uint uVar1;
  uint uVar2;
  Vec_Vec_t *pVVar3;
  void **ppvVar4;
  void *pvVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint Entry;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  int local_90;
  ulong local_80;
  
  if (nStates < 1) {
    __assert_fail("nStates > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                  ,0x71,"Vec_Vec_t *Gia_ManAssignCodes(int, int, int *)");
  }
  if (4 < kHot - 1U) {
    __assert_fail("kHot >= 1 && kHot <= 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                  ,0x72,"Vec_Vec_t *Gia_ManAssignCodes(int, int, int *)");
  }
  uVar6 = (ulong)(uint)nStates;
  pVVar3 = (Vec_Vec_t *)malloc(0x10);
  uVar15 = 8;
  if (8 < (uint)nStates) {
    uVar15 = (ulong)(uint)nStates;
  }
  pVVar3->nCap = (int)uVar15;
  ppvVar4 = (void **)malloc(uVar15 << 3);
  pVVar3->pArray = ppvVar4;
  uVar15 = 0;
  do {
    pvVar5 = calloc(1,0x10);
    ppvVar4[uVar15] = pvVar5;
    uVar15 = uVar15 + 1;
  } while (uVar6 != uVar15);
  pVVar3->nSize = nStates;
  *pnBits = -1;
  uVar12 = kHot;
  switch(kHot - 1U) {
  case 0:
    uVar15 = 0;
    while( true ) {
      uVar13 = (ulong)pVVar3->nSize;
      uVar14 = uVar15 + 1;
      if ((long)uVar13 <= (long)uVar15) {
        iVar18 = (int)uVar14;
        if ((long)pVVar3->nCap <= (long)uVar15) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(uVar14 * 8);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,uVar14 * 8);
            uVar13 = (ulong)pVVar3->nSize;
          }
          pVVar3->pArray = ppvVar4;
          pVVar3->nCap = iVar18;
        }
        if ((long)uVar13 <= (long)uVar15) {
          do {
            uVar20 = uVar13 + 1;
            pvVar5 = calloc(1,0x10);
            pVVar3->pArray[uVar13] = pvVar5;
            uVar13 = uVar20;
          } while (uVar14 != (uVar20 & 0xffffffff));
        }
        pVVar3->nSize = iVar18;
        uVar13 = (ulong)iVar18;
      }
      if ((long)uVar13 <= (long)uVar15) break;
      Vec_IntPush((Vec_Int_t *)pVVar3->pArray[uVar15],(int)uVar15);
      uVar15 = uVar14;
      if (uVar14 == uVar6) {
        *pnBits = nStates;
        return pVVar3;
      }
    }
LAB_007def1d:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                  ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
  case 1:
    do {
      if (nStates <= (int)((kHot - 1U) * kHot) / 2) goto LAB_007de331;
      kHot = kHot + 1;
    } while (kHot != 1000000000);
    kHot = 1000000000;
LAB_007de331:
    *pnBits = kHot;
    uVar16 = 0;
    uVar12 = 0;
    do {
      uVar1 = uVar12 + 1;
      if (uVar1 < (uint)kHot) {
        uVar14 = (long)(int)uVar16;
        uVar9 = uVar1;
        uVar2 = uVar16;
        do {
          uVar2 = uVar2 + 1;
          lVar11 = (long)pVVar3->nSize;
          uVar15 = uVar14 + 1;
          local_90 = (int)uVar15;
          if (lVar11 <= (long)uVar14) {
            if ((long)pVVar3->nCap <= (long)uVar14) {
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc((long)local_90 << 3);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar3->pArray,(long)local_90 << 3);
                lVar11 = (long)pVVar3->nSize;
              }
              pVVar3->pArray = ppvVar4;
              pVVar3->nCap = local_90;
            }
            if (lVar11 <= (long)uVar14) {
              iVar18 = uVar2 - (int)lVar11;
              do {
                pvVar5 = calloc(1,0x10);
                pVVar3->pArray[lVar11] = pvVar5;
                lVar11 = lVar11 + 1;
                iVar18 = iVar18 + -1;
              } while (iVar18 != 0);
            }
            pVVar3->nSize = local_90;
            lVar11 = (long)local_90;
          }
          if (((int)uVar16 < 0) || (lVar11 <= (long)uVar14)) goto LAB_007def1d;
          Vec_IntPush((Vec_Int_t *)pVVar3->pArray[uVar14],uVar12);
          lVar11 = (long)pVVar3->nSize;
          if (lVar11 <= (long)uVar14) {
            if ((long)pVVar3->nCap <= (long)uVar14) {
              uVar13 = uVar15 * 8 & 0x7fffffff8;
              if (pVVar3->pArray == (void **)0x0) {
                ppvVar4 = (void **)malloc(uVar13);
              }
              else {
                ppvVar4 = (void **)realloc(pVVar3->pArray,uVar13);
                lVar11 = (long)pVVar3->nSize;
              }
              pVVar3->pArray = ppvVar4;
              pVVar3->nCap = local_90;
            }
            if (lVar11 <= (long)uVar14) {
              do {
                pvVar5 = calloc(1,0x10);
                pVVar3->pArray[lVar11] = pvVar5;
                lVar11 = lVar11 + 1;
              } while (uVar2 != (uint)lVar11);
            }
            pVVar3->nSize = local_90;
            lVar11 = (long)local_90;
          }
          if (lVar11 <= (long)uVar14) goto LAB_007def1d;
          Vec_IntPush((Vec_Int_t *)pVVar3->pArray[uVar14],uVar9);
          if (uVar9 == (int)uVar6 - uVar16) {
            return pVVar3;
          }
          uVar9 = uVar9 + 1;
          uVar14 = uVar15;
        } while (uVar9 != kHot);
      }
      else {
        uVar15 = (ulong)uVar16;
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      uVar16 = (uint)uVar15;
      uVar12 = uVar1;
    } while (uVar1 != kHot);
    goto switchD_007de25a_default;
  case 2:
    uVar16 = kHot;
    do {
      if (nStates <= (int)((uVar16 - 2) * (uVar16 - 1) * uVar16) / 6) goto LAB_007de536;
      uVar16 = uVar16 + 1;
    } while (uVar16 != 1000000000);
    uVar16 = 1000000000;
LAB_007de536:
    *pnBits = uVar16;
    local_80 = 0;
    uVar1 = 0;
    do {
      uVar8 = (int)uVar6 + 1;
      uVar7 = uVar1 + 1;
      uVar2 = uVar8;
      uVar9 = uVar7;
      if (uVar7 < uVar16) {
        do {
          uVar21 = uVar9 + 1;
          uVar6 = local_80;
          if (uVar21 < uVar16) {
            uVar15 = (long)(int)local_80;
            uVar10 = uVar21;
            iVar18 = (int)local_80;
            do {
              iVar18 = iVar18 + 1;
              lVar11 = (long)pVVar3->nSize;
              uVar6 = uVar15 + 1;
              local_90 = (int)uVar6;
              if (lVar11 <= (long)uVar15) {
                if ((long)pVVar3->nCap <= (long)uVar15) {
                  if (pVVar3->pArray == (void **)0x0) {
                    ppvVar4 = (void **)malloc((long)local_90 << 3);
                  }
                  else {
                    ppvVar4 = (void **)realloc(pVVar3->pArray,(long)local_90 << 3);
                    lVar11 = (long)pVVar3->nSize;
                  }
                  pVVar3->pArray = ppvVar4;
                  pVVar3->nCap = local_90;
                }
                if (lVar11 <= (long)uVar15) {
                  iVar19 = iVar18 - (int)lVar11;
                  do {
                    pvVar5 = calloc(1,0x10);
                    pVVar3->pArray[lVar11] = pvVar5;
                    lVar11 = lVar11 + 1;
                    iVar19 = iVar19 + -1;
                  } while (iVar19 != 0);
                }
                pVVar3->nSize = local_90;
                lVar11 = (long)local_90;
              }
              if (((int)local_80 < 0) || (lVar11 <= (long)uVar15)) goto LAB_007def1d;
              Vec_IntPush((Vec_Int_t *)pVVar3->pArray[uVar15],uVar1);
              lVar11 = (long)pVVar3->nSize;
              if (lVar11 <= (long)uVar15) {
                if ((long)pVVar3->nCap <= (long)uVar15) {
                  uVar14 = uVar6 * 8 & 0x7fffffff8;
                  if (pVVar3->pArray == (void **)0x0) {
                    ppvVar4 = (void **)malloc(uVar14);
                  }
                  else {
                    ppvVar4 = (void **)realloc(pVVar3->pArray,uVar14);
                    lVar11 = (long)pVVar3->nSize;
                  }
                  pVVar3->pArray = ppvVar4;
                  pVVar3->nCap = local_90;
                }
                if (lVar11 <= (long)uVar15) {
                  do {
                    pvVar5 = calloc(1,0x10);
                    pVVar3->pArray[lVar11] = pvVar5;
                    lVar11 = lVar11 + 1;
                  } while (iVar18 != (int)lVar11);
                }
                pVVar3->nSize = local_90;
                lVar11 = (long)local_90;
              }
              if (lVar11 <= (long)uVar15) goto LAB_007def1d;
              Vec_IntPush((Vec_Int_t *)pVVar3->pArray[uVar15],uVar9);
              lVar11 = (long)pVVar3->nSize;
              if (lVar11 <= (long)uVar15) {
                if ((long)pVVar3->nCap <= (long)uVar15) {
                  if (pVVar3->pArray == (void **)0x0) {
                    ppvVar4 = (void **)malloc(uVar6 * 8);
                  }
                  else {
                    ppvVar4 = (void **)realloc(pVVar3->pArray,uVar6 * 8);
                    lVar11 = (long)pVVar3->nSize;
                  }
                  pVVar3->pArray = ppvVar4;
                  pVVar3->nCap = local_90;
                }
                if (lVar11 <= (long)uVar15) {
                  do {
                    pvVar5 = calloc(1,0x10);
                    pVVar3->pArray[lVar11] = pvVar5;
                    lVar11 = lVar11 + 1;
                  } while (iVar18 != (int)lVar11);
                }
                pVVar3->nSize = local_90;
                lVar11 = (long)local_90;
              }
              if (lVar11 <= (long)uVar15) goto LAB_007def1d;
              Vec_IntPush((Vec_Int_t *)pVVar3->pArray[uVar15],uVar10);
              if (uVar10 == uVar2 - (int)local_80) {
                return pVVar3;
              }
              uVar10 = uVar10 + 1;
              uVar15 = uVar6;
            } while (uVar10 < uVar16);
          }
          uVar2 = uVar2 + 1;
          local_80 = uVar6 & 0xffffffff;
          uVar9 = uVar21;
        } while (uVar21 != uVar16);
      }
      uVar6 = (ulong)uVar8;
      uVar1 = uVar7;
    } while (uVar7 != uVar16);
    if (kHot == 4) goto switchD_007de25a_caseD_3;
    break;
  case 3:
switchD_007de25a_caseD_3:
    do {
      if (nStates <= (int)((uVar12 - 3) * (uVar12 - 2) * (uVar12 - 1) * uVar12) / 0x18)
      goto LAB_007de826;
      uVar12 = uVar12 + 1;
    } while (uVar12 != 1000000000);
    uVar12 = 1000000000;
LAB_007de826:
    *pnBits = uVar12;
    uVar6 = 0;
    uVar16 = 0;
    do {
      uVar2 = uVar16 + 1;
      uVar1 = uVar2;
      if (uVar2 < uVar12) {
        do {
          uVar8 = uVar1 + 1;
          uVar9 = uVar8;
          uVar15 = uVar6;
          while (uVar7 = uVar9, uVar6 = uVar15, uVar7 < uVar12) {
            local_80 = uVar15 & 0xffffffff;
            uVar6 = local_80;
            uVar9 = uVar7 + 1;
            local_80._0_4_ = (int)uVar15;
            if (uVar12 <= uVar9) break;
            uVar6 = (long)(int)local_80;
            uVar21 = uVar9;
            iVar18 = (int)local_80;
            do {
              iVar18 = iVar18 + 1;
              lVar11 = (long)pVVar3->nSize;
              uVar15 = uVar6 + 1;
              iVar19 = (int)uVar15;
              if (lVar11 <= (long)uVar6) {
                if ((long)pVVar3->nCap <= (long)uVar6) {
                  if (pVVar3->pArray == (void **)0x0) {
                    ppvVar4 = (void **)malloc((long)iVar19 << 3);
                  }
                  else {
                    ppvVar4 = (void **)realloc(pVVar3->pArray,(long)iVar19 << 3);
                    lVar11 = (long)pVVar3->nSize;
                  }
                  pVVar3->pArray = ppvVar4;
                  pVVar3->nCap = iVar19;
                }
                if (lVar11 <= (long)uVar6) {
                  iVar17 = iVar18 - (int)lVar11;
                  do {
                    pvVar5 = calloc(1,0x10);
                    pVVar3->pArray[lVar11] = pvVar5;
                    lVar11 = lVar11 + 1;
                    iVar17 = iVar17 + -1;
                  } while (iVar17 != 0);
                }
                pVVar3->nSize = iVar19;
                lVar11 = (long)iVar19;
              }
              if (((int)local_80 < 0) || (lVar11 <= (long)uVar6)) goto LAB_007def1d;
              Vec_IntPush((Vec_Int_t *)pVVar3->pArray[uVar6],uVar16);
              lVar11 = (long)pVVar3->nSize;
              if (lVar11 <= (long)uVar6) {
                if ((long)pVVar3->nCap <= (long)uVar6) {
                  uVar14 = uVar15 * 8 & 0x7fffffff8;
                  if (pVVar3->pArray == (void **)0x0) {
                    ppvVar4 = (void **)malloc(uVar14);
                  }
                  else {
                    ppvVar4 = (void **)realloc(pVVar3->pArray,uVar14);
                    lVar11 = (long)pVVar3->nSize;
                  }
                  pVVar3->pArray = ppvVar4;
                  pVVar3->nCap = iVar19;
                }
                if (lVar11 <= (long)uVar6) {
                  do {
                    pvVar5 = calloc(1,0x10);
                    pVVar3->pArray[lVar11] = pvVar5;
                    lVar11 = lVar11 + 1;
                  } while (iVar18 != (int)lVar11);
                }
                pVVar3->nSize = iVar19;
                lVar11 = (long)iVar19;
              }
              if (lVar11 <= (long)uVar6) goto LAB_007def1d;
              Vec_IntPush((Vec_Int_t *)pVVar3->pArray[uVar6],uVar1);
              lVar11 = (long)pVVar3->nSize;
              if (lVar11 <= (long)uVar6) {
                if ((long)pVVar3->nCap <= (long)uVar6) {
                  if (pVVar3->pArray == (void **)0x0) {
                    ppvVar4 = (void **)malloc(uVar15 * 8);
                  }
                  else {
                    ppvVar4 = (void **)realloc(pVVar3->pArray,uVar15 * 8);
                    lVar11 = (long)pVVar3->nSize;
                  }
                  pVVar3->pArray = ppvVar4;
                  pVVar3->nCap = iVar19;
                }
                if (lVar11 <= (long)uVar6) {
                  do {
                    pvVar5 = calloc(1,0x10);
                    pVVar3->pArray[lVar11] = pvVar5;
                    lVar11 = lVar11 + 1;
                  } while (iVar18 != (int)lVar11);
                }
                pVVar3->nSize = iVar19;
                lVar11 = (long)iVar19;
              }
              if (lVar11 <= (long)uVar6) goto LAB_007def1d;
              Vec_IntPush((Vec_Int_t *)pVVar3->pArray[uVar6],uVar7);
              lVar11 = (long)pVVar3->nSize;
              if (lVar11 <= (long)uVar6) {
                if ((long)pVVar3->nCap <= (long)uVar6) {
                  if (pVVar3->pArray == (void **)0x0) {
                    ppvVar4 = (void **)malloc(uVar15 * 8);
                  }
                  else {
                    ppvVar4 = (void **)realloc(pVVar3->pArray,uVar15 * 8);
                    lVar11 = (long)pVVar3->nSize;
                  }
                  pVVar3->pArray = ppvVar4;
                  pVVar3->nCap = iVar19;
                }
                if (lVar11 <= (long)uVar6) {
                  do {
                    pvVar5 = calloc(1,0x10);
                    pVVar3->pArray[lVar11] = pvVar5;
                    lVar11 = lVar11 + 1;
                  } while (iVar18 != (int)lVar11);
                }
                pVVar3->nSize = iVar19;
                lVar11 = (long)iVar19;
              }
              if (lVar11 <= (long)uVar6) goto LAB_007def1d;
              Vec_IntPush((Vec_Int_t *)pVVar3->pArray[uVar6],uVar21);
              if (iVar19 == nStates) {
                return pVVar3;
              }
              uVar21 = uVar21 + 1;
              uVar6 = uVar15;
            } while ((int)uVar21 < (int)uVar12);
          }
          uVar1 = uVar8;
        } while (uVar8 != uVar12);
      }
      uVar16 = uVar2;
    } while (uVar2 != uVar12);
    uVar12 = 5;
    break;
  case 4:
    goto switchD_007de25a_caseD_4;
  default:
    goto switchD_007de25a_default;
  }
  if (kHot == 5) {
switchD_007de25a_caseD_4:
    do {
      if (nStates <=
          (int)((uVar12 - 4) * (uVar12 - 3) * (uVar12 - 2) * (uVar12 - 1) * uVar12) / 0x78)
      goto LAB_007deb6d;
      uVar12 = uVar12 + 1;
    } while (uVar12 != 1000000000);
    uVar12 = 1000000000;
LAB_007deb6d:
    *pnBits = uVar12;
    uVar6 = 0;
    uVar16 = 0;
    do {
      uVar2 = uVar16 + 1;
      uVar1 = uVar2;
      if (uVar2 < uVar12) {
        do {
          uVar8 = uVar1 + 1;
          uVar9 = uVar8;
          uVar15 = uVar6;
joined_r0x007deba6:
          uVar6 = uVar15;
          uVar7 = uVar9;
          if (uVar7 < uVar12) {
            uVar6 = uVar6 & 0xffffffff;
            uVar9 = uVar7 + 1;
            uVar21 = uVar9;
            if (uVar12 <= uVar9) goto LAB_007deeee;
            do {
              uVar10 = uVar21 + 1;
              iVar18 = (int)uVar6;
              uVar15 = uVar6;
              if ((int)uVar12 <= (int)uVar10) break;
              uVar6 = (long)iVar18;
              Entry = uVar10;
              iVar19 = iVar18;
              do {
                iVar19 = iVar19 + 1;
                lVar11 = (long)pVVar3->nSize;
                uVar15 = uVar6 + 1;
                iVar17 = (int)uVar15;
                if (lVar11 <= (long)uVar6) {
                  if ((long)pVVar3->nCap <= (long)uVar6) {
                    if (pVVar3->pArray == (void **)0x0) {
                      ppvVar4 = (void **)malloc((long)iVar17 << 3);
                    }
                    else {
                      ppvVar4 = (void **)realloc(pVVar3->pArray,(long)iVar17 << 3);
                      lVar11 = (long)pVVar3->nSize;
                    }
                    pVVar3->pArray = ppvVar4;
                    pVVar3->nCap = iVar17;
                  }
                  if (lVar11 <= (long)uVar6) {
                    iVar22 = iVar19 - (int)lVar11;
                    do {
                      pvVar5 = calloc(1,0x10);
                      pVVar3->pArray[lVar11] = pvVar5;
                      lVar11 = lVar11 + 1;
                      iVar22 = iVar22 + -1;
                    } while (iVar22 != 0);
                  }
                  pVVar3->nSize = iVar17;
                  lVar11 = (long)iVar17;
                }
                if ((iVar18 < 0) || (lVar11 <= (long)uVar6)) goto LAB_007def1d;
                Vec_IntPush((Vec_Int_t *)pVVar3->pArray[uVar6],uVar16);
                lVar11 = (long)pVVar3->nSize;
                if (lVar11 <= (long)uVar6) {
                  if ((long)pVVar3->nCap <= (long)uVar6) {
                    uVar14 = uVar15 * 8 & 0x7fffffff8;
                    if (pVVar3->pArray == (void **)0x0) {
                      ppvVar4 = (void **)malloc(uVar14);
                    }
                    else {
                      ppvVar4 = (void **)realloc(pVVar3->pArray,uVar14);
                      lVar11 = (long)pVVar3->nSize;
                    }
                    pVVar3->pArray = ppvVar4;
                    pVVar3->nCap = iVar17;
                  }
                  if (lVar11 <= (long)uVar6) {
                    do {
                      pvVar5 = calloc(1,0x10);
                      pVVar3->pArray[lVar11] = pvVar5;
                      lVar11 = lVar11 + 1;
                    } while (iVar19 != (int)lVar11);
                  }
                  pVVar3->nSize = iVar17;
                  lVar11 = (long)iVar17;
                }
                if (lVar11 <= (long)uVar6) goto LAB_007def1d;
                Vec_IntPush((Vec_Int_t *)pVVar3->pArray[uVar6],uVar1);
                lVar11 = (long)pVVar3->nSize;
                if (lVar11 <= (long)uVar6) {
                  if ((long)pVVar3->nCap <= (long)uVar6) {
                    if (pVVar3->pArray == (void **)0x0) {
                      ppvVar4 = (void **)malloc(uVar15 * 8);
                    }
                    else {
                      ppvVar4 = (void **)realloc(pVVar3->pArray,uVar15 * 8);
                      lVar11 = (long)pVVar3->nSize;
                    }
                    pVVar3->pArray = ppvVar4;
                    pVVar3->nCap = iVar17;
                  }
                  if (lVar11 <= (long)uVar6) {
                    do {
                      pvVar5 = calloc(1,0x10);
                      pVVar3->pArray[lVar11] = pvVar5;
                      lVar11 = lVar11 + 1;
                    } while (iVar19 != (int)lVar11);
                  }
                  pVVar3->nSize = iVar17;
                  lVar11 = (long)iVar17;
                }
                if (lVar11 <= (long)uVar6) goto LAB_007def1d;
                Vec_IntPush((Vec_Int_t *)pVVar3->pArray[uVar6],uVar7);
                lVar11 = (long)pVVar3->nSize;
                if (lVar11 <= (long)uVar6) {
                  if ((long)pVVar3->nCap <= (long)uVar6) {
                    if (pVVar3->pArray == (void **)0x0) {
                      ppvVar4 = (void **)malloc(uVar15 * 8);
                    }
                    else {
                      ppvVar4 = (void **)realloc(pVVar3->pArray,uVar15 * 8);
                      lVar11 = (long)pVVar3->nSize;
                    }
                    pVVar3->pArray = ppvVar4;
                    pVVar3->nCap = iVar17;
                  }
                  if (lVar11 <= (long)uVar6) {
                    do {
                      pvVar5 = calloc(1,0x10);
                      pVVar3->pArray[lVar11] = pvVar5;
                      lVar11 = lVar11 + 1;
                    } while (iVar19 != (int)lVar11);
                  }
                  pVVar3->nSize = iVar17;
                  lVar11 = (long)iVar17;
                }
                if (lVar11 <= (long)uVar6) goto LAB_007def1d;
                Vec_IntPush((Vec_Int_t *)pVVar3->pArray[uVar6],uVar21);
                lVar11 = (long)pVVar3->nSize;
                if (lVar11 <= (long)uVar6) {
                  if ((long)pVVar3->nCap <= (long)uVar6) {
                    if (pVVar3->pArray == (void **)0x0) {
                      ppvVar4 = (void **)malloc(uVar15 * 8);
                    }
                    else {
                      ppvVar4 = (void **)realloc(pVVar3->pArray,uVar15 * 8);
                      lVar11 = (long)pVVar3->nSize;
                    }
                    pVVar3->pArray = ppvVar4;
                    pVVar3->nCap = iVar17;
                  }
                  if (lVar11 <= (long)uVar6) {
                    do {
                      pvVar5 = calloc(1,0x10);
                      pVVar3->pArray[lVar11] = pvVar5;
                      lVar11 = lVar11 + 1;
                    } while (iVar19 != (int)lVar11);
                  }
                  pVVar3->nSize = iVar17;
                  lVar11 = (long)iVar17;
                }
                if (lVar11 <= (long)uVar6) goto LAB_007def1d;
                Vec_IntPush((Vec_Int_t *)pVVar3->pArray[uVar6],Entry);
                if (iVar17 == nStates) {
                  return pVVar3;
                }
                Entry = Entry + 1;
                uVar6 = uVar15;
              } while ((int)Entry < (int)uVar12);
              uVar6 = uVar15 & 0xffffffff;
              uVar21 = uVar10;
            } while ((int)uVar10 < (int)uVar12);
            goto joined_r0x007deba6;
          }
LAB_007deeee:
          uVar1 = uVar8;
        } while (uVar8 != uVar12);
      }
      uVar16 = uVar2;
    } while (uVar2 != uVar12);
  }
switchD_007de25a_default:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                ,200,"Vec_Vec_t *Gia_ManAssignCodes(int, int, int *)");
}

Assistant:

Vec_Vec_t * Gia_ManAssignCodes( int kHot, int nStates, int * pnBits )
{
    Vec_Vec_t * vCodes;
    int s, i1, i2, i3, i4, i5, nBits;
    assert( nStates > 0 );
    assert( kHot >= 1 && kHot <= 5 );
    vCodes = Vec_VecStart( nStates );
    *pnBits = -1;
    if ( kHot == 1 )
    {
        for ( i1 = 0; i1 < nStates; i1++ )
            Vec_VecPushInt( vCodes, i1, i1 );
        *pnBits = nStates;
        return vCodes;
    }
    if ( kHot == 2 )
    {
        for ( nBits = kHot; nBits < ABC_INFINITY; nBits++ )
            if ( nBits * (nBits-1) / 2 >= nStates )
                break;
        *pnBits = nBits;
        s = 0;
        for ( i1 = 0; i1 < nBits; i1++ )
        for ( i2 = i1 + 1; i2 < nBits; i2++ )
        {
            Vec_VecPushInt( vCodes, s, i1 );
            Vec_VecPushInt( vCodes, s, i2 );
            if ( ++s == nStates )
                return vCodes;
        }
    }
    if ( kHot == 3 )
    {
        for ( nBits = kHot; nBits < ABC_INFINITY; nBits++ )
            if ( nBits * (nBits-1) * (nBits-2) / 6 >= nStates )
                break;       
        *pnBits = nBits;
        s = 0;
        for ( i1 = 0; i1 < nBits; i1++ )
        for ( i2 = i1 + 1; i2 < nBits; i2++ )
        for ( i3 = i2 + 1; i3 < nBits; i3++ )
        {
            Vec_VecPushInt( vCodes, s, i1 );
            Vec_VecPushInt( vCodes, s, i2 );
            Vec_VecPushInt( vCodes, s, i3 );
            if ( ++s == nStates )
                return vCodes;
        }
    }
    if ( kHot == 4 )
    {
        for ( nBits = kHot; nBits < ABC_INFINITY; nBits++ )
            if ( nBits * (nBits-1) * (nBits-2) * (nBits-3) / 24 >= nStates )
                break;       
        *pnBits = nBits;
        s = 0;
        for ( i1 = 0; i1 < nBits; i1++ )
        for ( i2 = i1 + 1; i2 < nBits; i2++ )
        for ( i3 = i2 + 1; i3 < nBits; i3++ )
        for ( i4 = i3 + 1; i4 < nBits; i4++ )
        {
            Vec_VecPushInt( vCodes, s, i1 );
            Vec_VecPushInt( vCodes, s, i2 );
            Vec_VecPushInt( vCodes, s, i3 );
            Vec_VecPushInt( vCodes, s, i4 );
            if ( ++s == nStates )
                return vCodes;
        }
    }
    if ( kHot == 5 )
    {
        for ( nBits = kHot; nBits < ABC_INFINITY; nBits++ )
            if ( nBits * (nBits-1) * (nBits-2) * (nBits-3) * (nBits-4) / 120 >= nStates )
                break;       
        *pnBits = nBits;
        s = 0;
        for ( i1 = 0; i1 < nBits; i1++ )
        for ( i2 = i1 + 1; i2 < nBits; i2++ )
        for ( i3 = i2 + 1; i3 < nBits; i3++ )
        for ( i4 = i3 + 1; i4 < nBits; i4++ )
        for ( i5 = i4 + 1; i5 < nBits; i5++ )
        {
            Vec_VecPushInt( vCodes, s, i1 );
            Vec_VecPushInt( vCodes, s, i2 );
            Vec_VecPushInt( vCodes, s, i3 );
            Vec_VecPushInt( vCodes, s, i4 );
            Vec_VecPushInt( vCodes, s, i5 );
            if ( ++s == nStates )
                return vCodes;
        }
    }
    assert( 0 );
    return NULL;
}